

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

uint8 * google::protobuf::internal::WireFormatLite::WriteSInt64ToArray
                  (int field_number,int64 value,uint8 *target)

{
  bool bVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = field_number << 3;
  uVar3 = uVar6;
  if (0x7f < uVar6) {
    do {
      *target = (byte)uVar6 | 0x80;
      uVar3 = uVar6 >> 7;
      target = target + 1;
      bVar1 = 0x3fff < uVar6;
      uVar6 = uVar3;
    } while (bVar1);
  }
  *target = (byte)uVar3;
  pbVar2 = target + 1;
  uVar4 = value >> 0x3f ^ value * 2;
  uVar5 = uVar4;
  if (0x7f < uVar4) {
    do {
      *pbVar2 = (byte)uVar5 | 0x80;
      uVar4 = uVar5 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar5;
      uVar5 = uVar4;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar4;
  return pbVar2 + 1;
}

Assistant:

inline uint8* WireFormatLite::WriteSInt64ToArray(int field_number,
                                                 int64 value,
                                                 uint8* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteSInt64NoTagToArray(value, target);
}